

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

ParseResult __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<16u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  Ch *pCVar2;
  MemoryStream *pMVar3;
  byte *pbVar4;
  ulong uVar5;
  undefined4 uVar6;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *s;
  ParseResult PVar7;
  
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  pMVar3 = is->is_;
  pbVar4 = (byte *)pMVar3->src_;
  pbVar1 = (byte *)pMVar3->end_;
  do {
    if (pbVar4 == pbVar1) {
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)*pbVar4;
    }
    do {
      if ((0x20 < (byte)uVar5) || ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0)) {
        pbVar4 = (byte *)pMVar3->src_;
        uVar6 = 1;
        if ((pbVar4 == pbVar1) || (*pbVar4 == 0)) goto LAB_002b601c;
        ParseValue<16u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) != 0) goto LAB_002b6004;
        pMVar3 = is->is_;
        pbVar4 = (byte *)pMVar3->src_;
        pbVar1 = (byte *)pMVar3->end_;
        do {
          if (pbVar4 == pbVar1) {
            uVar5 = 0;
          }
          else {
            uVar5 = (ulong)*pbVar4;
          }
          do {
            if ((0x20 < (byte)uVar5) || ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0)) {
              pbVar4 = (byte *)pMVar3->src_;
              if ((pbVar4 != pbVar1) && (*pbVar4 != 0)) {
                uVar6 = 2;
LAB_002b601c:
                pCVar2 = pMVar3->begin_;
                *(undefined4 *)(this + 0x30) = uVar6;
                *(long *)(this + 0x38) = (long)pbVar4 - (long)pCVar2;
              }
LAB_002b6004:
              PVar7._4_4_ = 0;
              PVar7.code_ = *(uint *)(this + 0x30);
              *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
              PVar7.offset_ = *(size_t *)(this + 0x38);
              return PVar7;
            }
            uVar5 = 0;
          } while (pbVar4 == pbVar1);
          pbVar4 = pbVar4 + 1;
          pMVar3->src_ = (Ch *)pbVar4;
        } while( true );
      }
      uVar5 = 0;
    } while (pbVar4 == pbVar1);
    pbVar4 = pbVar4 + 1;
    pMVar3->src_ = (Ch *)pbVar4;
  } while( true );
}

Assistant:

ParseResult Parse(InputStream& is, Handler& handler) {
        if (parseFlags & kParseIterativeFlag)
            return IterativeParse<parseFlags>(is, handler);

        parseResult_.Clear();

        ClearStackOnExit scope(*this);

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

        if (RAPIDJSON_UNLIKELY(is.Peek() == '\0')) {
            RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentEmpty, is.Tell());
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
        }
        else {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

            if (!(parseFlags & kParseStopWhenDoneFlag)) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

                if (RAPIDJSON_UNLIKELY(is.Peek() != '\0')) {
                    RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentRootNotSingular, is.Tell());
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
                }
            }
        }

        return parseResult_;
    }